

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O1

void __thiscall
dtc::text_input_buffer::text_input_buffer
          (text_input_buffer *this,
          unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *b,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *d,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *i,string *directory,FILE *deps)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  __alloc_node_gen_t __alloc_node_gen;
  shared_ptr<dtc::input_buffer> local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  (this->defines)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->defines)._M_h._M_bucket_count = (d->_M_h)._M_bucket_count;
  (this->defines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->defines)._M_h._M_element_count = (d->_M_h)._M_element_count;
  uVar3 = *(undefined4 *)&(d->_M_h)._M_rehash_policy.field_0x4;
  sVar2 = (d->_M_h)._M_rehash_policy._M_next_resize;
  (this->defines)._M_h._M_rehash_policy._M_max_load_factor =
       (d->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->defines)._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->defines)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->defines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_48.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this,&d->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_48);
  this->cursor = 0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->input_stack).c.
  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       *)&this->input_stack,0);
  local_38 = &this->include_paths;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_38,i);
  (this->dir)._M_dataplus._M_p = (pointer)&(this->dir).field_2;
  pcVar1 = (directory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->dir,pcVar1,pcVar1 + directory->_M_string_length);
  this->depfile = deps;
  std::__shared_ptr<dtc::input_buffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>,void>
            ((__shared_ptr<dtc::input_buffer,(__gnu_cxx::_Lock_policy)2> *)&local_48,b);
  std::deque<std::shared_ptr<dtc::input_buffer>,std::allocator<std::shared_ptr<dtc::input_buffer>>>
  ::emplace_back<std::shared_ptr<dtc::input_buffer>>
            ((deque<std::shared_ptr<dtc::input_buffer>,std::allocator<std::shared_ptr<dtc::input_buffer>>>
              *)&this->input_stack,&local_48);
  if (local_48.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

text_input_buffer(std::unique_ptr<input_buffer> &&b,
	                  std::unordered_set<std::string> &&d,
	                  std::vector<std::string> &&i,
	                  const std::string directory,
	                  FILE *deps)
		: defines(d), include_paths(i), dir(directory), depfile(deps)
	{
		input_stack.push(std::move(b));
	}